

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

ExactFloat
util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Dot<0ul,1ul,2ul>
          (ExactFloat *sum,ExactFloat *a,ExactFloat *b,undefined8 param_4)

{
  initializer_list<bool> iVar1;
  BigNum extraout_RDX;
  ExactFloat EVar2;
  ExactFloat local_88;
  ExactFloat local_78 [2];
  ExactFloat local_58;
  bool local_43 [3];
  iterator local_40;
  undefined8 local_38;
  undefined8 local_30;
  ExactFloat *b_local;
  ExactFloat *a_local;
  ExactFloat *sum_local;
  ExactFloat *local_10;
  
  local_30 = param_4;
  b_local = b;
  a_local = a;
  local_10 = sum;
  ::operator*(&local_58,b);
  ExactFloat::operator+=(a,&local_58);
  local_43[0] = true;
  ::operator*(local_78,b_local + 1);
  ExactFloat::operator+=(a,local_78);
  local_43[1] = true;
  ::operator*(&local_88,b_local + 2);
  ExactFloat::operator+=(a,&local_88);
  local_43[2] = true;
  local_40 = local_43;
  local_38 = 3;
  iVar1._M_len = 3;
  iVar1._M_array = local_40;
  BasicVector<Vector3,_ExactFloat,_3UL>::Ignore(iVar1);
  ExactFloat::~ExactFloat(&local_88);
  ExactFloat::~ExactFloat(local_78);
  ExactFloat::~ExactFloat(&local_58);
  ExactFloat::ExactFloat(sum,a);
  EVar2.bn_.bn_ = extraout_RDX.bn_;
  EVar2._0_8_ = sum;
  return EVar2;
}

Assistant:

static T Dot(T sum, const T* a, const T* b, absl::index_sequence<Is...>) {
    Ignore({(sum += a[Is] * b[Is], true)...});
    return sum;
  }